

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O2

void __thiscall QTableView::setSortingEnabled(QTableView *this,bool enable)

{
  vector<QMetaObject::Connection,std::allocator<QMetaObject::Connection>> *this_00;
  long lVar1;
  Connection *pCVar2;
  void **ppvVar3;
  int column;
  SortOrder order;
  undefined4 *puVar4;
  Connection *connection;
  Connection *pCVar5;
  QTableViewPrivate *d;
  long lVar6;
  long in_FS_OFFSET;
  undefined8 in_stack_ffffffffffffff78;
  uint uVar7;
  code *local_58;
  undefined8 uStack_50;
  Connection local_48;
  QObject local_40 [8];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                    super_QWidget.field_0x8;
  QHeaderView::setSortIndicatorShown(*(QHeaderView **)(lVar1 + 0x580),enable);
  this_00 = (vector<QMetaObject::Connection,std::allocator<QMetaObject::Connection>> *)
            (lVar1 + 0x628);
  pCVar2 = *(Connection **)(lVar1 + 0x630);
  for (pCVar5 = *(Connection **)(lVar1 + 0x628);
      uVar7 = (uint)((ulong)in_stack_ffffffffffffff78 >> 0x20), pCVar5 != pCVar2;
      pCVar5 = pCVar5 + 1) {
    QObject::disconnect(pCVar5);
  }
  std::vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_>::clear
            ((vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_> *)this_00);
  if (enable) {
    column = QHeaderView::sortIndicatorSection(*(QHeaderView **)(lVar1 + 0x580));
    order = QHeaderView::sortIndicatorOrder(*(QHeaderView **)(lVar1 + 0x580));
    sortByColumn(this,column,order);
    local_58 = QTableViewPrivate::sortIndicatorChanged;
    uStack_50 = 0;
    QObjectPrivate::
    connect<void(QHeaderView::*)(int,Qt::SortOrder),void(QTableViewPrivate::*)(int,Qt::SortOrder)>
              ((Object *)&local_48,*(offset_in_QHeaderView_to_subr *)(lVar1 + 0x580),
               (Object *)QHeaderView::sortIndicatorChanged,0,(ConnectionType)lVar1);
    std::vector<QMetaObject::Connection,std::allocator<QMetaObject::Connection>>::
    _M_assign_aux<QMetaObject::Connection_const*>(this_00,(Object *)&local_48,local_40);
    QMetaObject::Connection::~Connection(&local_48);
  }
  else {
    QObject::connect<void(QHeaderView::*)(int),void(QTableView::*)(int)>
              ((Object *)&local_48,*(offset_in_QHeaderView_to_subr *)(lVar1 + 0x580),
               (ContextType *)QHeaderView::sectionPressed,(offset_in_QTableView_to_subr *)0x0,
               (ConnectionType)this);
    ppvVar3 = *(void ***)(lVar1 + 0x580);
    local_58 = QHeaderView::sectionEntered;
    uStack_50 = 0;
    puVar4 = (undefined4 *)operator_new(0x18);
    *puVar4 = 1;
    *(code **)(puVar4 + 2) =
         QtPrivate::
         QCallableObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/widgets/itemviews/qtableview.cpp:2752:27),_QtPrivate::List<int>,_void>
         ::impl;
    *(long *)(puVar4 + 4) = lVar1;
    QObject::connectImpl
              (local_40,ppvVar3,(QObject *)&local_58,(void **)this,(QSlotObjectBase *)0x0,
               (ConnectionType)puVar4,(int *)((ulong)uVar7 << 0x20),(QMetaObject *)0x0);
    std::vector<QMetaObject::Connection,std::allocator<QMetaObject::Connection>>::
    _M_assign_aux<QMetaObject::Connection_const*>(this_00,&local_48,&local_38);
    lVar6 = 8;
    do {
      QMetaObject::Connection::~Connection((Connection *)((long)&local_48.d_ptr + lVar6));
      lVar6 = lVar6 + -8;
    } while (lVar6 != -8);
  }
  *(bool *)(lVar1 + 0x640) = enable;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTableView::setSortingEnabled(bool enable)
{
    Q_D(QTableView);
    horizontalHeader()->setSortIndicatorShown(enable);
    for (const QMetaObject::Connection &connection : d->dynHorHeaderConnections)
        disconnect(connection);
    d->dynHorHeaderConnections.clear();
    if (enable) {
        //sortByColumn has to be called before we connect or set the sortingEnabled flag
        // because otherwise it will not call sort on the model.
        sortByColumn(d->horizontalHeader->sortIndicatorSection(),
                     d->horizontalHeader->sortIndicatorOrder());
        d->dynHorHeaderConnections = {
            QObjectPrivate::connect(d->horizontalHeader, &QHeaderView::sortIndicatorChanged,
                                    d, &QTableViewPrivate::sortIndicatorChanged)
        };
    } else {
        d->dynHorHeaderConnections = {
            connect(d->horizontalHeader, &QHeaderView::sectionPressed,
                    this, &QTableView::selectColumn),
            connect(d->horizontalHeader, &QHeaderView::sectionEntered,
                    this, [d](int column) {d->selectColumn(column, false); })
        };
    }
    d->sortingEnabled = enable;
}